

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WhereExplainOneScan(Parse *pParse,SrcList *pTabList,WhereLevel *pLevel,u16 wctrlFlags)

{
  ushort in_CX;
  Vdbe *in_RDX;
  long in_RDI;
  int addr;
  Vdbe *v;
  int ret;
  SrcList *in_stack_00000038;
  int in_stack_00000044;
  Parse *in_stack_00000048;
  long local_38;
  Vdbe *p;
  int p1;
  undefined2 in_stack_ffffffffffffffe4;
  int op;
  
  op = CONCAT22(in_CX,in_stack_ffffffffffffffe4);
  p1 = 0;
  local_38 = in_RDI;
  if (*(long *)(in_RDI + 0xb0) != 0) {
    local_38 = *(long *)(in_RDI + 0xb0);
  }
  if (((*(char *)(local_38 + 0x133) == '\x02') &&
      ((*(uint *)(in_RDX->nStmtDefImmCons + 0x30) & 0x2000) == 0)) && ((in_CX & 0x20) == 0)) {
    p = *(Vdbe **)(in_RDI + 0x10);
    sqlite3VdbeCurrentAddr(p);
    p1 = sqlite3VdbeAddOp3(in_RDX,op,p1,(int)((ulong)p >> 0x20),(int)p);
    sqlite3WhereAddExplainText
              (in_stack_00000048,in_stack_00000044,in_stack_00000038,(WhereLevel *)pParse,
               pTabList._6_2_);
  }
  return p1;
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainOneScan(
  Parse *pParse,                  /* Parse context */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
  int ret = 0;
#if !defined(SQLITE_DEBUG)
  if( sqlite3ParseToplevel(pParse)->explain==2 || IS_STMT_SCANSTATUS(pParse->db) )
#endif
  {
    if( (pLevel->pWLoop->wsFlags & WHERE_MULTI_OR)==0
     && (wctrlFlags & WHERE_OR_SUBCLAUSE)==0
    ){
      Vdbe *v = pParse->pVdbe;
      int addr = sqlite3VdbeCurrentAddr(v);
      ret = sqlite3VdbeAddOp3(
          v, OP_Explain, addr, pParse->addrExplain, pLevel->pWLoop->rRun
      );
      sqlite3WhereAddExplainText(pParse, addr, pTabList, pLevel, wctrlFlags);
    }
  }
  return ret;
}